

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O2

Entry * __thiscall llvm::DWARFUnitIndex::getFromOffset(DWARFUnitIndex *this,uint32_t Offset)

{
  pointer ppEVar1;
  SectionContribution *pSVar2;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  __first;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  __last;
  Entry *in_RAX;
  long lVar3;
  Entry *pEVar4;
  pointer ppEVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t i;
  uint uVar8;
  __normal_iterator<llvm::DWARFUnitIndex::Entry_**,_std::vector<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>_>
  __last_00;
  Entry *local_38;
  
  if ((this->OffsetLookup).
      super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->OffsetLookup).
      super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_38 = in_RAX;
    for (uVar8 = 0; uVar8 != (this->Header).NumBuckets; uVar8 = uVar8 + 1) {
      pEVar4 = (this->Rows)._M_t.
               super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
               .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>)
          *(_Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
            *)&pEVar4[uVar8].Contributions._M_t.
               super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
          != (SectionContribution *)0x0) {
        local_38 = pEVar4 + uVar8;
        std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>::
        emplace_back<llvm::DWARFUnitIndex::Entry*>
                  ((vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>
                    *)&this->OffsetLookup,&local_38);
      }
    }
    __first._M_current =
         (this->OffsetLookup).
         super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->OffsetLookup).
         super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar7 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar3 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                  )this);
      if ((long)__last._M_current - (long)__first._M_current < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,__gnu_cxx::__ops::_Iter_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                    )this);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,__gnu_cxx::__ops::_Iter_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                    )this);
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llvm::DWARFUnitIndex::Entry**,std::vector<llvm::DWARFUnitIndex::Entry*,std::allocator<llvm::DWARFUnitIndex::Entry*>>>,__gnu_cxx::__ops::_Val_comp_iter<llvm::DWARFUnitIndex::getFromOffset(unsigned_int)const::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_third_party_llvm_project_DWARFUnitIndex_cpp:170:30)>
                      )this);
        }
      }
    }
  }
  ppEVar1 = (this->OffsetLookup).
            super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)this->InfoColumn;
  ppEVar5 = ppEVar1;
  uVar7 = (long)(this->OffsetLookup).
                super__Vector_base<llvm::DWARFUnitIndex::Entry_*,_std::allocator<llvm::DWARFUnitIndex::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3;
  while (uVar6 = uVar7, 0 < (long)uVar6) {
    uVar7 = uVar6 >> 1;
    if (*(uint *)((long)(ppEVar5[uVar7]->Contributions)._M_t.
                        super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                        ._M_t + lVar3 * 8) <= Offset) {
      ppEVar5 = ppEVar5 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar6;
    }
  }
  if (ppEVar5 == ppEVar1) {
    pEVar4 = (Entry *)0x0;
  }
  else {
    pSVar2 = (ppEVar5[-1]->Contributions)._M_t.
             super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
             .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>.
             _M_head_impl;
    pEVar4 = (Entry *)0x0;
    if (Offset < pSVar2[lVar3].Length + pSVar2[lVar3].Offset) {
      pEVar4 = ppEVar5[-1];
    }
  }
  return pEVar4;
}

Assistant:

const DWARFUnitIndex::Entry *
DWARFUnitIndex::getFromOffset(uint32_t Offset) const {
  if (OffsetLookup.empty()) {
    for (uint32_t i = 0; i != Header.NumBuckets; ++i)
      if (Rows[i].Contributions)
        OffsetLookup.push_back(&Rows[i]);
    llvm::sort(OffsetLookup, [&](Entry *E1, Entry *E2) {
      return E1->Contributions[InfoColumn].Offset <
             E2->Contributions[InfoColumn].Offset;
    });
  }
  auto I = partition_point(OffsetLookup, [&](Entry *E2) {
    return E2->Contributions[InfoColumn].Offset <= Offset;
  });
  if (I == OffsetLookup.begin())
    return nullptr;
  --I;
  const auto *E = *I;
  const auto &InfoContrib = E->Contributions[InfoColumn];
  if ((InfoContrib.Offset + InfoContrib.Length) <= Offset)
    return nullptr;
  return E;
}